

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O2

void __thiscall Parse::TPTP::addTagState(TPTP *this,Tag t)

{
  Lib::Stack<Parse::TPTP::State>::push(&this->_states,TAG);
  Lib::Stack<Parse::TPTP::Tag>::push(&this->_tags,t);
  return;
}

Assistant:

void TPTP::addTagState(Tag t)
{
  _states.push(TAG);
  _tags.push(t);
}